

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::CompileRE2(int iters,string *regexp)

{
  int iVar1;
  bool bVar2;
  RE2 re;
  RE2 local_290;
  LogMessageFatal local_1b0;
  
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    RE2::RE2(&local_290,regexp);
    bVar2 = std::operator==(local_290.error_,"");
    if (!bVar2) {
      LogMessageFatal::LogMessageFatal
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x2d7);
      std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                      "Check failed: (re.error()) == (\"\")");
      LogMessageFatal::~LogMessageFatal(&local_1b0);
    }
    RE2::~RE2(&local_290);
  }
  return;
}

Assistant:

void CompileRE2(int iters, const string& regexp) {
  for (int i = 0; i < iters; i++) {
    RE2 re(regexp);
    CHECK_EQ(re.error(), "");
  }
}